

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::BVHNIntersector1<8,_257,_true,_embree::avx512::VirtualCurveIntersector1>::
     intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar4;
  bool bVar5;
  undefined1 auVar6 [32];
  undefined8 uVar7;
  ulong uVar8;
  byte bVar9;
  undefined1 auVar10 [12];
  undefined1 auVar11 [32];
  byte bVar12;
  ulong uVar13;
  long lVar14;
  byte bVar15;
  ulong uVar16;
  ulong *puVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [64];
  undefined1 auVar52 [32];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [16];
  undefined1 auVar56 [32];
  undefined1 auVar57 [64];
  float fVar58;
  undefined4 uVar59;
  vfloat4 a0;
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  float fVar62;
  float fVar66;
  float fVar67;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  undefined1 auVar65 [32];
  float fVar72;
  float fVar75;
  float fVar76;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar98 [64];
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  float local_23b8 [4];
  undefined1 local_23a8 [16];
  undefined1 local_2398 [16];
  undefined1 local_2388 [16];
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  undefined1 auVar25 [16];
  undefined1 auVar43 [32];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 != 8) {
    aVar4 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar23 = vdpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar4,0x7f);
    auVar10 = ZEXT812(0) << 0x20;
    auVar26 = ZEXT816(0) << 0x40;
    auVar22._4_12_ = auVar10;
    auVar22._0_4_ = auVar23._0_4_;
    auVar21 = vrsqrt14ss_avx512f(auVar26,auVar22);
    fVar58 = auVar21._0_4_;
    uVar2 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
    local_23b8[0] = fVar58 * 1.5 - auVar23._0_4_ * 0.5 * fVar58 * fVar58 * fVar58;
    uVar3 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
    fVar58 = (ray->super_RayK<1>).dir.field_0.m128[2];
    auVar60._0_4_ = aVar4.x * local_23b8[0];
    auVar60._4_4_ = aVar4.y * local_23b8[0];
    auVar60._8_4_ = aVar4.z * local_23b8[0];
    auVar60._12_4_ = aVar4.field_3.w * local_23b8[0];
    auVar21 = vshufpd_avx(auVar60,auVar60,1);
    auVar23 = vmovshdup_avx(auVar60);
    auVar89._8_4_ = 0x80000000;
    auVar89._0_8_ = 0x8000000080000000;
    auVar89._12_4_ = 0x80000000;
    auVar88._0_4_ = auVar23._0_4_ ^ 0x80000000;
    auVar23 = vunpckhps_avx(auVar60,auVar26);
    auVar88._4_12_ = auVar10;
    auVar24 = vshufps_avx(auVar23,auVar88,0x41);
    auVar73._0_8_ = auVar21._0_8_ ^ 0x8000000080000000;
    auVar73._8_8_ = auVar89._8_8_ ^ auVar21._8_8_;
    auVar22 = vinsertps_avx(auVar73,auVar60,0x2a);
    auVar23 = vdpps_avx(auVar24,auVar24,0x7f);
    auVar21 = vdpps_avx(auVar22,auVar22,0x7f);
    uVar7 = vcmpps_avx512vl(auVar21,auVar23,1);
    auVar23 = vpmovm2d_avx512vl(uVar7);
    auVar90._0_4_ = auVar23._0_4_;
    auVar90._4_4_ = auVar90._0_4_;
    auVar90._8_4_ = auVar90._0_4_;
    auVar90._12_4_ = auVar90._0_4_;
    uVar20 = vpmovd2m_avx512vl(auVar90);
    auVar23 = vpcmpeqd_avx(auVar90,auVar90);
    auVar21._4_4_ = (uint)((byte)(uVar20 >> 1) & 1) * auVar23._4_4_;
    auVar21._0_4_ = (uint)((byte)uVar20 & 1) * auVar23._0_4_;
    auVar21._8_4_ = (uint)((byte)(uVar20 >> 2) & 1) * auVar23._8_4_;
    auVar21._12_4_ = (uint)((byte)(uVar20 >> 3) & 1) * auVar23._12_4_;
    auVar23 = vblendvps_avx(auVar22,auVar24,auVar21);
    auVar21 = vdpps_avx(auVar23,auVar23,0x7f);
    auVar91._4_12_ = auVar10;
    auVar91._0_4_ = auVar21._0_4_;
    auVar22 = vrsqrt14ss_avx512f(auVar26,auVar91);
    fVar62 = auVar22._0_4_;
    fVar62 = fVar62 * 1.5 - fVar62 * fVar62 * fVar62 * auVar21._0_4_ * 0.5;
    auVar74._0_4_ = auVar23._0_4_ * fVar62;
    auVar74._4_4_ = auVar23._4_4_ * fVar62;
    auVar74._8_4_ = auVar23._8_4_ * fVar62;
    auVar74._12_4_ = auVar23._12_4_ * fVar62;
    auVar23 = vshufps_avx(auVar74,auVar74,0xc9);
    auVar21 = vshufps_avx(auVar60,auVar60,0xc9);
    auVar92._0_4_ = auVar21._0_4_ * auVar74._0_4_;
    auVar92._4_4_ = auVar21._4_4_ * auVar74._4_4_;
    auVar92._8_4_ = auVar21._8_4_ * auVar74._8_4_;
    auVar92._12_4_ = auVar21._12_4_ * auVar74._12_4_;
    auVar23 = vfmsub231ps_fma(auVar92,auVar60,auVar23);
    auVar21 = vshufps_avx(auVar23,auVar23,0xc9);
    auVar23 = vdpps_avx(auVar21,auVar21,0x7f);
    auVar93._4_12_ = auVar10;
    auVar93._0_4_ = auVar23._0_4_;
    auVar22 = vrsqrt14ss_avx512f(auVar26,auVar93);
    fVar62 = auVar22._0_4_;
    fVar62 = fVar62 * 1.5 - fVar62 * fVar62 * fVar62 * auVar23._0_4_ * 0.5;
    auVar63._0_4_ = fVar62 * auVar21._0_4_;
    auVar63._4_4_ = fVar62 * auVar21._4_4_;
    auVar63._8_4_ = fVar62 * auVar21._8_4_;
    auVar63._12_4_ = fVar62 * auVar21._12_4_;
    auVar55._0_4_ = local_23b8[0] * auVar60._0_4_;
    auVar55._4_4_ = local_23b8[0] * auVar60._4_4_;
    auVar55._8_4_ = local_23b8[0] * auVar60._8_4_;
    auVar55._12_4_ = local_23b8[0] * auVar60._12_4_;
    auVar22 = vunpcklps_avx(auVar74,auVar55);
    auVar23 = vunpckhps_avx(auVar74,auVar55);
    auVar24 = vunpcklps_avx(auVar63,auVar26);
    auVar21 = vunpckhps_avx(auVar63,auVar26);
    local_2388 = vunpcklps_avx(auVar23,auVar21);
    local_23a8 = vunpcklps_avx(auVar22,auVar24);
    local_2398 = vunpckhps_avx(auVar22,auVar24);
    puVar17 = local_2368;
    auVar21 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    auVar57 = ZEXT1664(auVar21);
    auVar22 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
    auVar23._8_4_ = 0x7fffffff;
    auVar23._0_8_ = 0x7fffffff7fffffff;
    auVar23._12_4_ = 0x7fffffff;
    auVar23 = vandps_avx512vl((undefined1  [16])aVar4,auVar23);
    auVar24._8_4_ = 0x219392ef;
    auVar24._0_8_ = 0x219392ef219392ef;
    auVar24._12_4_ = 0x219392ef;
    uVar20 = vcmpps_avx512vl(auVar23,auVar24,1);
    local_2370[0] = 0;
    auVar64._8_4_ = 0x3f800000;
    auVar64._0_8_ = 0x3f8000003f800000;
    auVar64._12_4_ = 0x3f800000;
    auVar23 = vdivps_avx(auVar64,(undefined1  [16])aVar4);
    auVar24 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar5 = (bool)((byte)uVar20 & 1);
    auVar25._0_4_ = (uint)bVar5 * auVar24._0_4_ | (uint)!bVar5 * auVar23._0_4_;
    bVar5 = (bool)((byte)(uVar20 >> 1) & 1);
    auVar25._4_4_ = (uint)bVar5 * auVar24._4_4_ | (uint)!bVar5 * auVar23._4_4_;
    bVar5 = (bool)((byte)(uVar20 >> 2) & 1);
    auVar25._8_4_ = (uint)bVar5 * auVar24._8_4_ | (uint)!bVar5 * auVar23._8_4_;
    bVar5 = (bool)((byte)(uVar20 >> 3) & 1);
    auVar25._12_4_ = (uint)bVar5 * auVar24._12_4_ | (uint)!bVar5 * auVar23._12_4_;
    auVar26._8_4_ = 0x3f7ffffa;
    auVar26._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar26._12_4_ = 0x3f7ffffa;
    auVar26 = vmulps_avx512vl(auVar25,auVar26);
    auVar27._8_4_ = 0x3f800003;
    auVar27._0_8_ = 0x3f8000033f800003;
    auVar27._12_4_ = 0x3f800003;
    auVar27 = vmulps_avx512vl(auVar25,auVar27);
    auVar28 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
    auVar29 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar30 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    auVar31 = vbroadcastss_avx512vl(auVar26);
    auVar23 = vmovshdup_avx(auVar26);
    auVar32 = vbroadcastsd_avx512vl(auVar23);
    auVar36._8_4_ = 2;
    auVar36._0_8_ = 0x200000002;
    auVar36._12_4_ = 2;
    auVar36._16_4_ = 2;
    auVar36._20_4_ = 2;
    auVar36._24_4_ = 2;
    auVar36._28_4_ = 2;
    auVar24 = vshufpd_avx(auVar26,auVar26,1);
    auVar33 = vpermps_avx512vl(auVar36,ZEXT1632(auVar26));
    auVar34 = vbroadcastss_avx512vl(auVar27);
    auVar35._8_4_ = 1;
    auVar35._0_8_ = 0x100000001;
    auVar35._12_4_ = 1;
    auVar35._16_4_ = 1;
    auVar35._20_4_ = 1;
    auVar35._24_4_ = 1;
    auVar35._28_4_ = 1;
    auVar35 = vpermps_avx512vl(auVar35,ZEXT1632(auVar27));
    auVar36 = vpermps_avx512vl(auVar36,ZEXT1632(auVar27));
    uVar19 = (ulong)(auVar26._0_4_ < 0.0) * 0x20;
    uVar18 = (ulong)(auVar23._0_4_ < 0.0) << 5 | 0x40;
    uVar20 = (ulong)(auVar24._0_4_ < 0.0) << 5 | 0x80;
    auVar37 = vbroadcastss_avx512vl(auVar21);
    uVar59 = auVar22._0_4_;
    auVar51 = ZEXT3264(CONCAT428(uVar59,CONCAT424(uVar59,CONCAT420(uVar59,CONCAT416(uVar59,CONCAT412
                                                  (uVar59,CONCAT48(uVar59,CONCAT44(uVar59,uVar59))))
                                                  ))));
    auVar38 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
    auVar97 = ZEXT3264(auVar38);
    auVar38 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
    auVar98 = ZEXT3264(auVar38);
    do {
      pfVar1 = (float *)(puVar17 + -1);
      auVar53 = ZEXT464((uint)*pfVar1);
      puVar17 = puVar17 + -2;
      if (*pfVar1 <= (ray->super_RayK<1>).tfar) {
        uVar16 = *puVar17;
LAB_01f15aa0:
        if ((uVar16 & 0xf) == 0) {
          auVar38 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar16 + 0x40 + uVar19),auVar28);
          auVar38 = vmulps_avx512vl(auVar31,auVar38);
          auVar39 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar16 + 0x40 + uVar18),auVar29);
          auVar39 = vmulps_avx512vl(auVar32,auVar39);
          auVar38 = vmaxps_avx(auVar38,auVar39);
          auVar39 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar16 + 0x40 + uVar20),auVar30);
          auVar40 = vmulps_avx512vl(auVar33,auVar39);
          auVar39 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar16 + 0x40 + (uVar19 ^ 0x20)),auVar28)
          ;
          auVar39 = vmulps_avx512vl(auVar34,auVar39);
          auVar41 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar16 + 0x40 + (uVar18 ^ 0x20)),auVar29)
          ;
          auVar41 = vmulps_avx512vl(auVar35,auVar41);
          auVar39 = vminps_avx(auVar39,auVar41);
          auVar41 = vsubps_avx512vl(*(undefined1 (*) [32])(uVar16 + 0x40 + (uVar20 ^ 0x20)),auVar30)
          ;
          auVar41 = vmulps_avx512vl(auVar36,auVar41);
          auVar40 = vmaxps_avx512vl(auVar40,auVar37);
          auVar38 = vmaxps_avx(auVar38,auVar40);
          auVar40 = vminps_avx(auVar41,auVar51._0_32_);
          auVar39 = vminps_avx(auVar39,auVar40);
        }
        else {
          if ((int)(uVar16 & 0xf) != 2) {
            auVar57 = ZEXT1664(auVar57._0_16_);
            (**(code **)((long)This->leafIntersector +
                        (ulong)*(byte *)(uVar16 & 0xfffffffffffffff0) * 0x40))
                      (local_23b8,ray,context);
            auVar38 = vpbroadcastd_avx512vl(ZEXT416(0xfffffff8));
            auVar98 = ZEXT3264(auVar38);
            auVar38 = vpmovsxbd_avx512vl(ZEXT816(0x706050403020100));
            auVar97 = ZEXT3264(auVar38);
            fVar62 = (ray->super_RayK<1>).tfar;
            auVar51 = ZEXT3264(CONCAT428(fVar62,CONCAT424(fVar62,CONCAT420(fVar62,CONCAT416(fVar62,
                                                  CONCAT412(fVar62,CONCAT48(fVar62,CONCAT44(fVar62,
                                                  fVar62))))))));
            goto LAB_01f16088;
          }
          uVar13 = uVar16 & 0xfffffffffffffff0;
          auVar38 = *(undefined1 (*) [32])(uVar13 + 0x100);
          auVar54._0_4_ = fVar58 * auVar38._0_4_;
          auVar54._4_4_ = fVar58 * auVar38._4_4_;
          auVar54._8_4_ = fVar58 * auVar38._8_4_;
          auVar54._12_4_ = fVar58 * auVar38._12_4_;
          auVar54._16_4_ = fVar58 * auVar38._16_4_;
          auVar54._20_4_ = fVar58 * auVar38._20_4_;
          auVar54._28_36_ = auVar53._28_36_;
          auVar54._24_4_ = fVar58 * auVar38._24_4_;
          auVar39 = *(undefined1 (*) [32])(uVar13 + 0x120);
          auVar53._0_4_ = fVar58 * auVar39._0_4_;
          auVar53._4_4_ = fVar58 * auVar39._4_4_;
          auVar53._8_4_ = fVar58 * auVar39._8_4_;
          auVar53._12_4_ = fVar58 * auVar39._12_4_;
          auVar53._16_4_ = fVar58 * auVar39._16_4_;
          auVar53._20_4_ = fVar58 * auVar39._20_4_;
          auVar53._28_36_ = auVar57._28_36_;
          auVar53._24_4_ = fVar58 * auVar39._24_4_;
          auVar40 = *(undefined1 (*) [32])(uVar13 + 0x140);
          auVar42._4_4_ = fVar58 * auVar40._4_4_;
          auVar42._0_4_ = fVar58 * auVar40._0_4_;
          auVar42._8_4_ = fVar58 * auVar40._8_4_;
          auVar42._12_4_ = fVar58 * auVar40._12_4_;
          auVar42._16_4_ = fVar58 * auVar40._16_4_;
          auVar42._20_4_ = fVar58 * auVar40._20_4_;
          auVar42._24_4_ = fVar58 * auVar40._24_4_;
          auVar42._28_4_ = fVar58;
          auVar47._4_4_ = uVar3;
          auVar47._0_4_ = uVar3;
          auVar47._8_4_ = uVar3;
          auVar47._12_4_ = uVar3;
          auVar47._16_4_ = uVar3;
          auVar47._20_4_ = uVar3;
          auVar47._24_4_ = uVar3;
          auVar47._28_4_ = uVar3;
          auVar23 = vfmadd231ps_fma(auVar54._0_32_,auVar47,*(undefined1 (*) [32])(uVar13 + 0xa0));
          auVar21 = vfmadd231ps_fma(auVar53._0_32_,auVar47,*(undefined1 (*) [32])(uVar13 + 0xc0));
          auVar22 = vfmadd231ps_fma(auVar42,auVar47,*(undefined1 (*) [32])(uVar13 + 0xe0));
          auVar11._4_4_ = uVar2;
          auVar11._0_4_ = uVar2;
          auVar11._8_4_ = uVar2;
          auVar11._12_4_ = uVar2;
          auVar11._16_4_ = uVar2;
          auVar11._20_4_ = uVar2;
          auVar11._24_4_ = uVar2;
          auVar11._28_4_ = uVar2;
          auVar23 = vfmadd231ps_fma(ZEXT1632(auVar23),auVar11,*(undefined1 (*) [32])(uVar13 + 0x40))
          ;
          auVar21 = vfmadd231ps_fma(ZEXT1632(auVar21),auVar11,*(undefined1 (*) [32])(uVar13 + 0x60))
          ;
          auVar22 = vfmadd231ps_fma(ZEXT1632(auVar22),auVar11,*(undefined1 (*) [32])(uVar13 + 0x80))
          ;
          auVar94._8_4_ = 0x7fffffff;
          auVar94._0_8_ = 0x7fffffff7fffffff;
          auVar94._12_4_ = 0x7fffffff;
          auVar94._16_4_ = 0x7fffffff;
          auVar94._20_4_ = 0x7fffffff;
          auVar94._24_4_ = 0x7fffffff;
          auVar94._28_4_ = 0x7fffffff;
          auVar41 = vandps_avx(auVar94,ZEXT1632(auVar23));
          auVar96._8_4_ = 0x219392ef;
          auVar96._0_8_ = 0x219392ef219392ef;
          auVar96._12_4_ = 0x219392ef;
          auVar96._16_4_ = 0x219392ef;
          auVar96._20_4_ = 0x219392ef;
          auVar96._24_4_ = 0x219392ef;
          auVar96._28_4_ = 0x219392ef;
          uVar8 = vcmpps_avx512vl(auVar41,auVar96,1);
          bVar5 = (bool)((byte)uVar8 & 1);
          auVar44._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar23._0_4_;
          bVar5 = (bool)((byte)(uVar8 >> 1) & 1);
          auVar44._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar23._4_4_;
          bVar5 = (bool)((byte)(uVar8 >> 2) & 1);
          auVar44._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar23._8_4_;
          bVar5 = (bool)((byte)(uVar8 >> 3) & 1);
          auVar44._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar23._12_4_;
          auVar44._16_4_ = (uint)((byte)(uVar8 >> 4) & 1) * 0x219392ef;
          auVar44._20_4_ = (uint)((byte)(uVar8 >> 5) & 1) * 0x219392ef;
          auVar44._24_4_ = (uint)((byte)(uVar8 >> 6) & 1) * 0x219392ef;
          auVar44._28_4_ = (uint)(byte)(uVar8 >> 7) * 0x219392ef;
          auVar41 = vandps_avx(auVar94,ZEXT1632(auVar21));
          uVar8 = vcmpps_avx512vl(auVar41,auVar96,1);
          bVar5 = (bool)((byte)uVar8 & 1);
          auVar45._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar21._0_4_;
          bVar5 = (bool)((byte)(uVar8 >> 1) & 1);
          auVar45._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar21._4_4_;
          bVar5 = (bool)((byte)(uVar8 >> 2) & 1);
          auVar45._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar21._8_4_;
          bVar5 = (bool)((byte)(uVar8 >> 3) & 1);
          auVar45._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar21._12_4_;
          auVar45._16_4_ = (uint)((byte)(uVar8 >> 4) & 1) * 0x219392ef;
          auVar45._20_4_ = (uint)((byte)(uVar8 >> 5) & 1) * 0x219392ef;
          auVar45._24_4_ = (uint)((byte)(uVar8 >> 6) & 1) * 0x219392ef;
          auVar45._28_4_ = (uint)(byte)(uVar8 >> 7) * 0x219392ef;
          auVar41 = vandps_avx(auVar94,ZEXT1632(auVar22));
          uVar8 = vcmpps_avx512vl(auVar41,auVar96,1);
          bVar5 = (bool)((byte)uVar8 & 1);
          auVar46._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar22._0_4_;
          bVar5 = (bool)((byte)(uVar8 >> 1) & 1);
          auVar46._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar22._4_4_;
          bVar5 = (bool)((byte)(uVar8 >> 2) & 1);
          auVar46._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar22._8_4_;
          bVar5 = (bool)((byte)(uVar8 >> 3) & 1);
          auVar46._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar22._12_4_;
          auVar46._16_4_ = (uint)((byte)(uVar8 >> 4) & 1) * 0x219392ef;
          auVar46._20_4_ = (uint)((byte)(uVar8 >> 5) & 1) * 0x219392ef;
          auVar46._24_4_ = (uint)((byte)(uVar8 >> 6) & 1) * 0x219392ef;
          auVar46._28_4_ = (uint)(byte)(uVar8 >> 7) * 0x219392ef;
          auVar41 = vrcp14ps_avx512vl(auVar44);
          auVar95._8_4_ = 0x3f800000;
          auVar95._0_8_ = 0x3f8000003f800000;
          auVar95._12_4_ = 0x3f800000;
          auVar95._16_4_ = 0x3f800000;
          auVar95._20_4_ = 0x3f800000;
          auVar95._24_4_ = 0x3f800000;
          auVar95._28_4_ = 0x3f800000;
          auVar23 = vfnmadd213ps_fma(auVar44,auVar41,auVar95);
          auVar23 = vfmadd132ps_fma(ZEXT1632(auVar23),auVar41,auVar41);
          auVar41 = vrcp14ps_avx512vl(auVar45);
          auVar21 = vfnmadd213ps_fma(auVar45,auVar41,auVar95);
          auVar21 = vfmadd132ps_fma(ZEXT1632(auVar21),auVar41,auVar41);
          auVar41 = vrcp14ps_avx512vl(auVar46);
          auVar22 = vfnmadd213ps_fma(auVar46,auVar41,auVar95);
          auVar22 = vfmadd132ps_fma(ZEXT1632(auVar22),auVar41,auVar41);
          auVar38 = vfmadd213ps_avx512vl(auVar38,auVar30,*(undefined1 (*) [32])(uVar13 + 0x160));
          auVar39 = vfmadd213ps_avx512vl(auVar39,auVar30,*(undefined1 (*) [32])(uVar13 + 0x180));
          auVar40 = vfmadd213ps_avx512vl(auVar40,auVar30,*(undefined1 (*) [32])(uVar13 + 0x1a0));
          auVar38 = vfmadd231ps_avx512vl(auVar38,auVar29,*(undefined1 (*) [32])(uVar13 + 0xa0));
          auVar39 = vfmadd231ps_avx512vl(auVar39,auVar29,*(undefined1 (*) [32])(uVar13 + 0xc0));
          auVar40 = vfmadd231ps_avx512vl(auVar40,auVar29,*(undefined1 (*) [32])(uVar13 + 0xe0));
          auVar38 = vfmadd231ps_avx512vl(auVar38,auVar28,*(undefined1 (*) [32])(uVar13 + 0x40));
          fVar81 = -auVar23._0_4_ * auVar38._0_4_;
          fVar82 = -auVar23._4_4_ * auVar38._4_4_;
          auVar49._4_4_ = fVar82;
          auVar49._0_4_ = fVar81;
          fVar83 = -auVar23._8_4_ * auVar38._8_4_;
          auVar49._8_4_ = fVar83;
          fVar84 = -auVar23._12_4_ * auVar38._12_4_;
          auVar49._12_4_ = fVar84;
          fVar85 = auVar38._16_4_ * -0.0;
          auVar49._16_4_ = fVar85;
          fVar86 = auVar38._20_4_ * -0.0;
          auVar49._20_4_ = fVar86;
          fVar87 = auVar38._24_4_ * -0.0;
          auVar49._24_4_ = fVar87;
          auVar49._28_4_ = auVar38._28_4_;
          auVar39 = vfmadd231ps_avx512vl(auVar39,auVar28,*(undefined1 (*) [32])(uVar13 + 0x60));
          fVar72 = -auVar21._0_4_ * auVar39._0_4_;
          fVar75 = -auVar21._4_4_ * auVar39._4_4_;
          auVar6._4_4_ = fVar75;
          auVar6._0_4_ = fVar72;
          fVar76 = -auVar21._8_4_ * auVar39._8_4_;
          auVar6._8_4_ = fVar76;
          fVar77 = -auVar21._12_4_ * auVar39._12_4_;
          auVar6._12_4_ = fVar77;
          fVar78 = auVar39._16_4_ * -0.0;
          auVar6._16_4_ = fVar78;
          fVar79 = auVar39._20_4_ * -0.0;
          auVar6._20_4_ = fVar79;
          fVar80 = auVar39._24_4_ * -0.0;
          auVar6._24_4_ = fVar80;
          auVar6._28_4_ = auVar39._28_4_;
          auVar40 = vfmadd231ps_avx512vl(auVar40,auVar28,*(undefined1 (*) [32])(uVar13 + 0x80));
          fVar62 = -auVar22._0_4_ * auVar40._0_4_;
          fVar66 = -auVar22._4_4_ * auVar40._4_4_;
          auVar48._4_4_ = fVar66;
          auVar48._0_4_ = fVar62;
          fVar67 = -auVar22._8_4_ * auVar40._8_4_;
          auVar48._8_4_ = fVar67;
          fVar68 = -auVar22._12_4_ * auVar40._12_4_;
          auVar48._12_4_ = fVar68;
          fVar69 = auVar40._16_4_ * -0.0;
          auVar48._16_4_ = fVar69;
          fVar70 = auVar40._20_4_ * -0.0;
          auVar48._20_4_ = fVar70;
          fVar71 = auVar40._24_4_ * -0.0;
          auVar48._24_4_ = fVar71;
          auVar48._28_4_ = auVar40._28_4_;
          auVar52._0_4_ = auVar23._0_4_ + fVar81;
          auVar52._4_4_ = auVar23._4_4_ + fVar82;
          auVar52._8_4_ = auVar23._8_4_ + fVar83;
          auVar52._12_4_ = auVar23._12_4_ + fVar84;
          auVar52._16_4_ = fVar85 + 0.0;
          auVar52._20_4_ = fVar86 + 0.0;
          auVar52._24_4_ = fVar87 + 0.0;
          auVar52._28_4_ = auVar38._28_4_ + 0.0;
          auVar56._0_4_ = auVar21._0_4_ + fVar72;
          auVar56._4_4_ = auVar21._4_4_ + fVar75;
          auVar56._8_4_ = auVar21._8_4_ + fVar76;
          auVar56._12_4_ = auVar21._12_4_ + fVar77;
          auVar56._16_4_ = fVar78 + 0.0;
          auVar56._20_4_ = fVar79 + 0.0;
          auVar56._24_4_ = fVar80 + 0.0;
          auVar56._28_4_ = auVar39._28_4_ + 0.0;
          auVar61._0_4_ = auVar22._0_4_ + fVar62;
          auVar61._4_4_ = auVar22._4_4_ + fVar66;
          auVar61._8_4_ = auVar22._8_4_ + fVar67;
          auVar61._12_4_ = auVar22._12_4_ + fVar68;
          auVar61._16_4_ = fVar69 + 0.0;
          auVar61._20_4_ = fVar70 + 0.0;
          auVar61._24_4_ = fVar71 + 0.0;
          auVar61._28_4_ = auVar40._28_4_ + 0.0;
          auVar42 = vpminsd_avx2(auVar49,auVar52);
          auVar38 = vpminsd_avx2(auVar6,auVar56);
          auVar39 = vpminsd_avx2(auVar48,auVar61);
          auVar38 = vmaxps_avx(auVar38,auVar39);
          auVar40 = vpmaxsd_avx2(auVar49,auVar52);
          auVar39 = vpmaxsd_avx2(auVar6,auVar56);
          auVar41 = vpmaxsd_avx2(auVar48,auVar61);
          auVar39 = vminps_avx(auVar39,auVar41);
          auVar41 = vmaxps_avx512vl(auVar37,auVar42);
          auVar38 = vmaxps_avx(auVar41,auVar38);
          auVar40 = vminps_avx(auVar51._0_32_,auVar40);
          auVar39 = vminps_avx(auVar40,auVar39);
          auVar40._8_4_ = 0x3f7ffffa;
          auVar40._0_8_ = 0x3f7ffffa3f7ffffa;
          auVar40._12_4_ = 0x3f7ffffa;
          auVar40._16_4_ = 0x3f7ffffa;
          auVar40._20_4_ = 0x3f7ffffa;
          auVar40._24_4_ = 0x3f7ffffa;
          auVar40._28_4_ = 0x3f7ffffa;
          auVar38 = vmulps_avx512vl(auVar38,auVar40);
          auVar41._8_4_ = 0x3f800003;
          auVar41._0_8_ = 0x3f8000033f800003;
          auVar41._12_4_ = 0x3f800003;
          auVar41._16_4_ = 0x3f800003;
          auVar41._20_4_ = 0x3f800003;
          auVar41._24_4_ = 0x3f800003;
          auVar41._28_4_ = 0x3f800003;
          auVar39 = vmulps_avx512vl(auVar39,auVar41);
        }
        auVar57 = ZEXT3264(auVar39);
        auVar53 = ZEXT3264(auVar38);
        uVar8 = vcmpps_avx512vl(auVar38,auVar39,2);
        bVar12 = (byte)uVar8;
        if (bVar12 == 0) goto LAB_01f16088;
        auVar39 = *(undefined1 (*) [32])(uVar16 & 0xfffffffffffffff0);
        auVar57 = ZEXT3264(auVar39);
        auVar40 = ((undefined1 (*) [32])(uVar16 & 0xfffffffffffffff0))[1];
        auVar41 = vmovdqa64_avx512vl(auVar97._0_32_);
        auVar41 = vpternlogd_avx512vl(auVar41,auVar38,auVar98._0_32_,0xf8);
        auVar42 = vpcompressd_avx512vl(auVar41);
        auVar43._0_4_ =
             (uint)(bVar12 & 1) * auVar42._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar41._0_4_;
        bVar5 = (bool)((byte)(uVar8 >> 1) & 1);
        auVar43._4_4_ = (uint)bVar5 * auVar42._4_4_ | (uint)!bVar5 * auVar41._4_4_;
        bVar5 = (bool)((byte)(uVar8 >> 2) & 1);
        auVar43._8_4_ = (uint)bVar5 * auVar42._8_4_ | (uint)!bVar5 * auVar41._8_4_;
        bVar5 = (bool)((byte)(uVar8 >> 3) & 1);
        auVar43._12_4_ = (uint)bVar5 * auVar42._12_4_ | (uint)!bVar5 * auVar41._12_4_;
        bVar5 = (bool)((byte)(uVar8 >> 4) & 1);
        auVar43._16_4_ = (uint)bVar5 * auVar42._16_4_ | (uint)!bVar5 * auVar41._16_4_;
        bVar5 = (bool)((byte)(uVar8 >> 5) & 1);
        auVar43._20_4_ = (uint)bVar5 * auVar42._20_4_ | (uint)!bVar5 * auVar41._20_4_;
        bVar5 = (bool)((byte)(uVar8 >> 6) & 1);
        auVar43._24_4_ = (uint)bVar5 * auVar42._24_4_ | (uint)!bVar5 * auVar41._24_4_;
        bVar5 = SUB81(uVar8 >> 7,0);
        auVar43._28_4_ = (uint)bVar5 * auVar42._28_4_ | (uint)!bVar5 * auVar41._28_4_;
        auVar41 = vpermt2q_avx512vl(auVar39,auVar43,auVar40);
        uVar16 = auVar41._0_8_;
        bVar12 = bVar12 - 1 & bVar12;
        if (bVar12 != 0) {
          auVar41 = vpshufd_avx2(auVar43,0x55);
          vpermt2q_avx512vl(auVar39,auVar41,auVar40);
          auVar42 = vpminsd_avx2(auVar43,auVar41);
          auVar41 = vpmaxsd_avx2(auVar43,auVar41);
          bVar12 = bVar12 - 1 & bVar12;
          if (bVar12 == 0) {
            auVar42 = vpermi2q_avx512vl(auVar42,auVar39,auVar40);
            uVar16 = auVar42._0_8_;
            auVar39 = vpermt2q_avx512vl(auVar39,auVar41,auVar40);
            auVar57 = ZEXT3264(auVar39);
            *puVar17 = auVar39._0_8_;
            auVar38 = vpermd_avx2(auVar41,auVar38);
            auVar53 = ZEXT3264(auVar38);
            *(int *)(puVar17 + 1) = auVar38._0_4_;
            puVar17 = puVar17 + 2;
          }
          else {
            auVar6 = vpshufd_avx2(auVar43,0xaa);
            vpermt2q_avx512vl(auVar39,auVar6,auVar40);
            auVar49 = vpminsd_avx2(auVar42,auVar6);
            auVar42 = vpmaxsd_avx2(auVar42,auVar6);
            auVar6 = vpminsd_avx2(auVar41,auVar42);
            auVar41 = vpmaxsd_avx2(auVar41,auVar42);
            bVar12 = bVar12 - 1 & bVar12;
            if (bVar12 == 0) {
              auVar42 = vpermi2q_avx512vl(auVar49,auVar39,auVar40);
              uVar16 = auVar42._0_8_;
              auVar42 = vpermt2q_avx512vl(auVar39,auVar41,auVar40);
              *puVar17 = auVar42._0_8_;
              auVar41 = vpermd_avx2(auVar41,auVar38);
              *(int *)(puVar17 + 1) = auVar41._0_4_;
              auVar39 = vpermt2q_avx512vl(auVar39,auVar6,auVar40);
              auVar57 = ZEXT3264(auVar39);
              puVar17[2] = auVar39._0_8_;
              auVar38 = vpermd_avx2(auVar6,auVar38);
              auVar53 = ZEXT3264(auVar38);
              *(int *)(puVar17 + 3) = auVar38._0_4_;
              puVar17 = puVar17 + 4;
            }
            else {
              auVar42 = vpshufd_avx2(auVar43,0xff);
              vpermt2q_avx512vl(auVar39,auVar42,auVar40);
              auVar48 = vpminsd_avx2(auVar49,auVar42);
              auVar42 = vpmaxsd_avx2(auVar49,auVar42);
              auVar49 = vpminsd_avx2(auVar6,auVar42);
              auVar42 = vpmaxsd_avx2(auVar6,auVar42);
              auVar6 = vpminsd_avx2(auVar41,auVar42);
              auVar41 = vpmaxsd_avx2(auVar41,auVar42);
              bVar12 = bVar12 - 1 & bVar12;
              if (bVar12 == 0) {
                auVar42 = vpermi2q_avx512vl(auVar48,auVar39,auVar40);
                uVar16 = auVar42._0_8_;
                auVar42 = vpermt2q_avx512vl(auVar39,auVar41,auVar40);
                *puVar17 = auVar42._0_8_;
                auVar41 = vpermd_avx2(auVar41,auVar38);
                *(int *)(puVar17 + 1) = auVar41._0_4_;
                auVar41 = vpermt2q_avx512vl(auVar39,auVar6,auVar40);
                puVar17[2] = auVar41._0_8_;
                auVar41 = vpermd_avx2(auVar6,auVar38);
                *(int *)(puVar17 + 3) = auVar41._0_4_;
                auVar39 = vpermt2q_avx512vl(auVar39,auVar49,auVar40);
                auVar57 = ZEXT3264(auVar39);
                puVar17[4] = auVar39._0_8_;
                auVar38 = vpermd_avx2(auVar49,auVar38);
                auVar53 = ZEXT3264(auVar38);
                *(int *)(puVar17 + 5) = auVar38._0_4_;
                puVar17 = puVar17 + 6;
              }
              else {
                auVar47 = valignd_avx512vl(auVar43,auVar43,3);
                auVar42 = vpmovsxbd_avx2(ZEXT816(0x303020108));
                auVar48 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                               CONCAT48(0x80000000,
                                                                        0x8000000080000000))),
                                            auVar42,auVar48);
                auVar42 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                auVar49 = vpermt2d_avx512vl(auVar48,auVar42,auVar49);
                auVar49 = vpermt2d_avx512vl(auVar49,auVar42,auVar6);
                auVar42 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                auVar41 = vpermt2d_avx512vl(auVar49,auVar42,auVar41);
                auVar57 = ZEXT3264(auVar41);
                bVar15 = bVar12;
                do {
                  auVar42 = auVar57._0_32_;
                  auVar65._8_4_ = 1;
                  auVar65._0_8_ = 0x100000001;
                  auVar65._12_4_ = 1;
                  auVar65._16_4_ = 1;
                  auVar65._20_4_ = 1;
                  auVar65._24_4_ = 1;
                  auVar65._28_4_ = 1;
                  auVar41 = vpermd_avx2(auVar65,auVar47);
                  auVar47 = valignd_avx512vl(auVar47,auVar47,1);
                  vpermt2q_avx512vl(auVar39,auVar47,auVar40);
                  bVar15 = bVar15 - 1 & bVar15;
                  uVar7 = vpcmpd_avx512vl(auVar41,auVar42,5);
                  auVar41 = vpmaxsd_avx2(auVar41,auVar42);
                  bVar9 = (byte)uVar7 << 1;
                  auVar42 = valignd_avx512vl(auVar42,auVar42,7);
                  bVar5 = (bool)((byte)uVar7 & 1);
                  auVar50._4_4_ = (uint)bVar5 * auVar42._4_4_ | (uint)!bVar5 * auVar41._4_4_;
                  auVar50._0_4_ = auVar41._0_4_;
                  bVar5 = (bool)(bVar9 >> 2 & 1);
                  auVar50._8_4_ = (uint)bVar5 * auVar42._8_4_ | (uint)!bVar5 * auVar41._8_4_;
                  bVar5 = (bool)(bVar9 >> 3 & 1);
                  auVar50._12_4_ = (uint)bVar5 * auVar42._12_4_ | (uint)!bVar5 * auVar41._12_4_;
                  bVar5 = (bool)(bVar9 >> 4 & 1);
                  auVar50._16_4_ = (uint)bVar5 * auVar42._16_4_ | (uint)!bVar5 * auVar41._16_4_;
                  bVar5 = (bool)(bVar9 >> 5 & 1);
                  auVar50._20_4_ = (uint)bVar5 * auVar42._20_4_ | (uint)!bVar5 * auVar41._20_4_;
                  bVar5 = (bool)(bVar9 >> 6 & 1);
                  auVar50._24_4_ = (uint)bVar5 * auVar42._24_4_ | (uint)!bVar5 * auVar41._24_4_;
                  auVar50._28_4_ =
                       (uint)(bVar9 >> 7) * auVar42._28_4_ |
                       (uint)!(bool)(bVar9 >> 7) * auVar41._28_4_;
                  auVar57 = ZEXT3264(auVar50);
                } while (bVar15 != 0);
                lVar14 = (ulong)(uint)POPCOUNT((uint)bVar12) + 3;
                do {
                  auVar41 = vpermi2q_avx512vl(auVar50,auVar39,auVar40);
                  *puVar17 = auVar41._0_8_;
                  auVar42 = auVar57._0_32_;
                  auVar41 = vpermd_avx2(auVar42,auVar38);
                  *(int *)(puVar17 + 1) = auVar41._0_4_;
                  auVar50 = valignd_avx512vl(auVar42,auVar42,1);
                  puVar17 = puVar17 + 2;
                  auVar57 = ZEXT3264(auVar50);
                  lVar14 = lVar14 + -1;
                } while (lVar14 != 0);
                auVar38 = vpermt2q_avx512vl(auVar39,auVar50,auVar40);
                auVar57 = ZEXT3264(auVar38);
                uVar16 = auVar38._0_8_;
              }
            }
          }
        }
        goto LAB_01f15aa0;
      }
LAB_01f16088:
    } while (puVar17 != &local_2378);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }